

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O0

void Map_CutFilter(Map_Man_t *p,Map_Node_t *pNode)

{
  Map_Cut_t *local_58;
  Map_Cut_t *local_50;
  int local_40;
  int Counter;
  int k;
  int i;
  Map_Cut_t *pCut2;
  Map_Cut_t *pCut;
  Map_Cut_t *pPrev;
  Map_Cut_t *pTemp;
  Map_Node_t *pNode_local;
  Map_Man_t *p_local;
  
  pCut = pNode->pCuts;
  pCut2 = pNode->pCuts->pNext;
  if (pCut2 == (Map_Cut_t *)0x0) {
    local_50 = (Map_Cut_t *)0x0;
  }
  else {
    local_50 = pCut2->pNext;
  }
  _k = local_50;
  do {
    if (pCut2 == (Map_Cut_t *)0x0) {
      return;
    }
    for (pPrev = pNode->pCuts->pNext; pPrev != pCut2; pPrev = pPrev->pNext) {
      for (Counter = 0; Counter < pPrev->nLeaves; Counter = Counter + 1) {
        for (local_40 = 0;
            (local_40 < pCut2->nLeaves && (pPrev->ppLeaves[Counter] != pCut2->ppLeaves[local_40]));
            local_40 = local_40 + 1) {
        }
        if (local_40 == pCut2->nLeaves) break;
      }
      if (Counter == pPrev->nLeaves) break;
    }
    if (pPrev == pCut2) {
      pCut = pCut2;
    }
    else {
      pCut->pNext = pCut2->pNext;
      Map_CutFree(p,pCut2);
    }
    pCut2 = _k;
    if (_k == (Map_Cut_t *)0x0) {
      local_58 = (Map_Cut_t *)0x0;
    }
    else {
      local_58 = _k->pNext;
    }
    _k = local_58;
  } while( true );
}

Assistant:

void Map_CutFilter( Map_Man_t * p, Map_Node_t * pNode )
{ 
    Map_Cut_t * pTemp, * pPrev, * pCut, * pCut2;
    int i, k, Counter;

    Counter = 0;
    pPrev = pNode->pCuts;
    Map_ListForEachCutSafe( pNode->pCuts->pNext, pCut, pCut2 )
    {
        // go through all the previous cuts up to pCut
        for ( pTemp = pNode->pCuts->pNext; pTemp != pCut; pTemp = pTemp->pNext )
        {
            // check if every node in pTemp is contained in pCut
            for ( i = 0; i < pTemp->nLeaves; i++ )
            {
                for ( k = 0; k < pCut->nLeaves; k++ )
                    if ( pTemp->ppLeaves[i] == pCut->ppLeaves[k] )
                        break;
                if ( k == pCut->nLeaves ) // node i in pTemp is not contained in pCut
                    break;
            }
            if ( i == pTemp->nLeaves ) // every node in pTemp is contained in pCut
            {
                Counter++;
                break;
            }
        }
        if ( pTemp != pCut ) // pTemp contain pCut
        {
            pPrev->pNext = pCut->pNext;  // skip pCut
            // recycle pCut
            Map_CutFree( p, pCut );
        }
        else 
            pPrev = pCut; 
    }
//  printf( "Dominated = %3d. \n", Counter );
}